

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pk.c
# Opt level: O0

int mbedtls_pk_verify(mbedtls_pk_context *ctx,mbedtls_md_type_t md_alg,uchar *hash,size_t hash_len,
                     uchar *sig,size_t sig_len)

{
  int iVar1;
  size_t sig_len_local;
  uchar *sig_local;
  size_t hash_len_local;
  uchar *hash_local;
  mbedtls_pk_context *pmStack_18;
  mbedtls_md_type_t md_alg_local;
  mbedtls_pk_context *ctx_local;
  
  if (((ctx != (mbedtls_pk_context *)0x0) && (ctx->pk_info != (mbedtls_pk_info_t *)0x0)) &&
     (sig_local = (uchar *)hash_len, hash_len_local = (size_t)hash, hash_local._4_4_ = md_alg,
     pmStack_18 = ctx, iVar1 = pk_hashlen_helper(md_alg,(size_t *)&sig_local), iVar1 == 0)) {
    if (pmStack_18->pk_info->verify_func ==
        (_func_int_void_ptr_mbedtls_md_type_t_uchar_ptr_size_t_uchar_ptr_size_t *)0x0) {
      return -0x3f00;
    }
    iVar1 = (*pmStack_18->pk_info->verify_func)
                      (pmStack_18->pk_ctx,hash_local._4_4_,(uchar *)hash_len_local,(size_t)sig_local
                       ,sig,sig_len);
    return iVar1;
  }
  return -16000;
}

Assistant:

int mbedtls_pk_verify( mbedtls_pk_context *ctx, mbedtls_md_type_t md_alg,
               const unsigned char *hash, size_t hash_len,
               const unsigned char *sig, size_t sig_len )
{
    if( ctx == NULL || ctx->pk_info == NULL ||
        pk_hashlen_helper( md_alg, &hash_len ) != 0 )
        return( MBEDTLS_ERR_PK_BAD_INPUT_DATA );

    if( ctx->pk_info->verify_func == NULL )
        return( MBEDTLS_ERR_PK_TYPE_MISMATCH );

    return( ctx->pk_info->verify_func( ctx->pk_ctx, md_alg, hash, hash_len,
                                       sig, sig_len ) );
}